

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::BW_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  ulong uVar1;
  byte bVar2;
  SQChar *pSVar3;
  SQChar *pSVar4;
  bool bVar5;
  ulong uVar6;
  
  if (((o2->super_SQObject)._type | (o1->super_SQObject)._type) != OT_INTEGER) {
    pSVar3 = GetTypeName(o1);
    pSVar4 = GetTypeName(o2);
    Raise_Error(this,"bitwise op between \'%s\' and \'%s\'",pSVar3,pSVar4);
    return false;
  }
  if (op < 7) {
    uVar6 = (o1->super_SQObject)._unVal.nInteger;
    uVar1 = (o2->super_SQObject)._unVal.nInteger;
    bVar2 = (byte)uVar1;
    switch(op) {
    case 0:
      uVar6 = uVar1 & uVar6;
      break;
    case 1:
      goto switchD_0011ab5d_caseD_1;
    case 2:
      uVar6 = uVar1 | uVar6;
      break;
    case 3:
      uVar6 = uVar1 ^ uVar6;
      break;
    case 4:
      uVar6 = uVar6 << (bVar2 & 0x3f);
      break;
    case 5:
      uVar6 = (long)uVar6 >> (bVar2 & 0x3f);
      break;
    case 6:
      uVar6 = uVar6 >> (bVar2 & 0x3f);
    }
    SQObjectPtr::operator=(trg,uVar6);
    bVar5 = true;
  }
  else {
switchD_0011ab5d_caseD_1:
    bVar5 = false;
    Raise_Error(this,"internal vm error bitwise op failed");
  }
  return bVar5;
}

Assistant:

bool SQVM::BW_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger res;
    if((sq_type(o1)| sq_type(o2)) == OT_INTEGER)
    {
        SQInteger i1 = _integer(o1), i2 = _integer(o2);
        switch(op) {
            case BW_AND:    res = i1 & i2; break;
            case BW_OR:     res = i1 | i2; break;
            case BW_XOR:    res = i1 ^ i2; break;
            case BW_SHIFTL: res = i1 << i2; break;
            case BW_SHIFTR: res = i1 >> i2; break;
            case BW_USHIFTR:res = (SQInteger)(*((SQUnsignedInteger*)&i1) >> i2); break;
            default: { Raise_Error(_SC("internal vm error bitwise op failed")); return false; }
        }
    }
    else { Raise_Error(_SC("bitwise op between '%s' and '%s'"),GetTypeName(o1),GetTypeName(o2)); return false;}
    trg = res;
    return true;
}